

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O2

RecyclerWeakReference<Js::EntryPointInfo> * __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
::Insert(WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
         *this,EntryPointInfo *key,uchar value,bool add,bool checkForExisting)

{
  WeakRefDictionaryEntry<Js::EntryPointInfo,_unsigned_char> *pWVar1;
  int iVar2;
  RecyclerWeakReference<Js::EntryPointInfo> *pRVar3;
  undefined7 in_register_00000009;
  uint key_00;
  int local_3c;
  undefined4 local_38;
  int previous;
  uint bucket;
  
  local_38 = (undefined4)CONCAT71(in_register_00000009,add);
  if ((this->buckets).ptr == (int *)0x0) {
    Initialize(this,0);
  }
  key_00 = (uint)((ulong)key >> 3) | 1;
  previous = PrimePolicy::ModPrime(key_00,this->size,this->modFunctionIndex);
  if (checkForExisting) {
    local_3c = -1;
    iVar2 = FindEntry<Js::EntryPointInfo>(this,key,key_00,(uint *)&previous,&local_3c);
    if (iVar2 != -1) {
      if ((char)local_38 == '\0') {
        pWVar1 = (this->entries).ptr;
        pWVar1[iVar2].value = value;
        this->version = this->version + 1;
        return pWVar1[iVar2].key.ptr;
      }
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
  }
  pRVar3 = Memory::Recycler::CreateWeakReferenceHandle<Js::EntryPointInfo>(this->recycler,key);
  pRVar3 = Insert(this,pRVar3,value,key_00,previous);
  return pRVar3;
}

Assistant:

const RecyclerWeakReference<TKey>* Insert(TKey* key, TValue value, bool add, bool checkForExisting = true)
        {
            if (buckets == nullptr) Initialize(0);

            hash_t hash = GetHashCode(key);
            uint bucket = PrimePolicy::GetBucket(hash, size, modFunctionIndex);

            if (checkForExisting)
            {
                int previous = -1;
                int i = FindEntry(key, hash, bucket, previous);

                if (i != -1)
                {
                    if (add)
                    {
                        Js::Throw::FatalInternalError();
                    }

                    entries[i].value = value;
                    version++;
                    return entries[i].key;
                }
            }

            // We know we need to insert- so first try creating the weak reference, before adding it to
            // the dictionary. If we OOM here, we still leave the dictionary as we found it.
            const RecyclerWeakReference<TKey>* weakRef = recycler->CreateWeakReferenceHandle<TKey>(key);

            return Insert(weakRef, value, hash, bucket);
        }